

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  uint uVar1;
  XMLSize_t XVar2;
  QName *pQVar3;
  XMLCh *str1;
  bool bVar4;
  MemoryManager *pMVar5;
  RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this;
  SchemaElementDecl **ppSVar6;
  XMLSize_t getAt;
  XSerializeEngine *this_00;
  XMLSize_t itemIndex;
  ulong uVar7;
  int key2;
  ElemVector *data;
  XMLCh *key1;
  XSerializeEngine *local_48;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  bVar4 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar4) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    local_48 = serEng;
    if (this == (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                 *)0x0) {
      pMVar5 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
              *)XMemory::operator_new(0x30,pMVar5);
      pMVar5 = XSerializeEngine::getMemoryManager(serEng);
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::RefHash2KeysTableOf(this,hashModulus,toAdopt,pMVar5);
      *objToLoad = this;
    }
    this_00 = local_48;
    XSerializeEngine::registerObject(local_48,this);
    itemNumber = 0;
    XSerializeEngine::readSize(this_00,&itemNumber);
    for (uVar7 = 0; uVar7 < itemNumber; uVar7 = uVar7 + 1) {
      XSerializeEngine::readString(this_00,&key1);
      XSerializeEngine::operator>>(this_00,&key2);
      data = (ElemVector *)0x0;
      loadObject(&data,8,false,this_00);
      XVar2 = data->fCurCount;
      getAt = 0;
      do {
        this_00 = local_48;
        if (XVar2 == getAt) goto LAB_002cd4e9;
        ppSVar6 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt(data,getAt);
        pQVar3 = ((*ppSVar6)->fSubstitutionGroupElem->super_XMLElementDecl).fElementName;
        str1 = pQVar3->fLocalPart;
        uVar1 = pQVar3->fURIId;
        bVar4 = XMLString::equals(str1,key1);
        this_00 = local_48;
        getAt = getAt + 1;
      } while ((!bVar4) || (uVar1 != key2));
      pMVar5 = XSerializeEngine::getMemoryManager(local_48);
      (*pMVar5->_vptr_MemoryManager[4])(pMVar5,key1);
      key1 = str1;
LAB_002cd4e9:
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(*objToLoad,key1,key2,data);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash2KeysTableOf<ElemVector>**      objToLoad
                                   , int
                                   , bool                                    toAdopt
                                   , XSerializeEngine&                       serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash2KeysTableOf<ElemVector>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLCh*      key1;
            serEng.readString(key1);

            int         key2;
            serEng>>key2;

            ElemVector*  data = 0;

            //don't call destructor
            loadObject(&data, 8, false, serEng);

            /***
             *
             *  There must be one element in the vector whose
             *  susbititutionGroupElem matches the (key1,key2)
             *
             ***/

            // bool FOUND=false;

            XMLSize_t vectorSize = data->size();
            for ( XMLSize_t i = 0; i < vectorSize; i++)
            {
                SchemaElementDecl*& elem   = data->elementAt(i);
                SchemaElementDecl*  subElem = elem->getSubstitutionGroupElem();
                XMLCh* elemName = subElem->getBaseName();
                int    uri      = subElem->getURI();
                if (XMLString::equals(elemName, key1) &&
                    (uri == key2)                       )
                {
                    //release the temp
                    serEng.getMemoryManager()->deallocate(key1);
                    key1 = elemName;
                    //FOUND=true;
                    break;
                }
            }

            /***
             * if (!FOUND)
             * {
             *     throw exception
             * }
             ***/

            (*objToLoad)->put((void*)key1, key2, data);

        }

    }
}